

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.h
# Opt level: O2

void __thiscall ncnn::Blob::~Blob(Blob *this)

{
  Mat::~Mat(&this->shape);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

class NCNN_EXPORT Blob
{
public:
    // empty
    Blob();

public:
#if NCNN_STRING
    // blob name
    std::string name;
#endif // NCNN_STRING
    // layer index which produce this blob as output
    int producer;
    // layer index which need this blob as input
    int consumer;
    // shape hint
    Mat shape;
}